

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_1::PosixEnv::NewLogger(PosixEnv *this,string *filename,Logger **result)

{
  int __fd;
  char *__file;
  int *piVar1;
  FILE *fp_00;
  PosixLogger *this_00;
  undefined8 *in_RCX;
  FILE *fp;
  int fd;
  Logger **result_local;
  string *filename_local;
  PosixEnv *this_local;
  
  __file = (char *)std::__cxx11::string::c_str();
  __fd = open(__file,0x80441,0x1a4);
  if (__fd < 0) {
    *in_RCX = 0;
    piVar1 = __errno_location();
    PosixError((anon_unknown_1 *)this,(string *)result,*piVar1);
  }
  else {
    fp_00 = fdopen(__fd,"w");
    if (fp_00 == (FILE *)0x0) {
      close(__fd);
      *in_RCX = 0;
      piVar1 = __errno_location();
      PosixError((anon_unknown_1 *)this,(string *)result,*piVar1);
    }
    else {
      this_00 = (PosixLogger *)operator_new(0x10);
      PosixLogger::PosixLogger(this_00,(FILE *)fp_00);
      *in_RCX = this_00;
      Status::OK();
    }
  }
  return (Status)(char *)this;
}

Assistant:

Status NewLogger(const std::string& filename, Logger** result) override {
    int fd = ::open(filename.c_str(),
                    O_APPEND | O_WRONLY | O_CREAT | kOpenBaseFlags, 0644);
    if (fd < 0) {
      *result = nullptr;
      return PosixError(filename, errno);
    }

    std::FILE* fp = ::fdopen(fd, "w");
    if (fp == nullptr) {
      ::close(fd);
      *result = nullptr;
      return PosixError(filename, errno);
    } else {
      *result = new PosixLogger(fp);
      return Status::OK();
    }
  }